

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_853dad::HandleHasItemCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,function<bool_(const_cmCMakePath_&)> *has_item)

{
  pointer pbVar1;
  bool bVar2;
  cmCMakePath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string inputPath;
  string local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 != 0x60) {
    path.Path._M_pathname._M_string_length = (size_type)(pbVar1->_M_dataplus)._M_p;
    path.Path._M_pathname._M_dataplus._M_p = (pointer)pbVar1->_M_string_length;
    inputPath._M_dataplus._M_p = (pointer)0x23;
    inputPath._M_string_length = (long)"IS_ABSOLUTE must be called with two arguments." + 0xb;
    cmStrCat<>(&local_38,(cmAlphaNum *)&path,(cmAlphaNum *)&inputPath);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&local_38);
    return false;
  }
  inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
  inputPath._M_string_length = 0;
  inputPath.field_2._M_local_buf[0] = '\0';
  bVar2 = getInputPath(pbVar1 + 1,status,&inputPath);
  if (bVar2) {
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_88,(string *)&inputPath);
      cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>(&path,&local_88,generic_format);
      std::__cxx11::string::~string((string *)&local_88);
      bVar2 = std::function<bool_(const_cmCMakePath_&)>::operator()(has_item,&path);
      cmMakefile::AddDefinitionBool
                (status->Makefile,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 2,bVar2);
      std::filesystem::__cxx11::path::~path(&path.Path);
      bVar2 = true;
      goto LAB_0026b0f8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,"Invalid name for output variable.",(allocator<char> *)&local_38);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&path);
  }
  bVar2 = false;
LAB_0026b0f8:
  std::__cxx11::string::~string((string *)&inputPath);
  return bVar2;
}

Assistant:

bool HandleHasItemCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<bool(const cmCMakePath&)>& has_item)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args.front(), " must be called with two arguments."));
    return false;
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  if (args[2].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  cmCMakePath path(inputPath);
  auto result = has_item(path);

  status.GetMakefile().AddDefinitionBool(args[2], result);

  return true;
}